

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

char * __thiscall
QNetworkReplyImplPrivate::getDownloadBuffer(QNetworkReplyImplPrivate *this,qint64 size)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  long in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImpl *q;
  QVariant bufferAllocationPolicy;
  QSharedPointer<char> *in_stack_ffffffffffffff50;
  QSharedPointer<char> *this_00;
  Attribute in_stack_ffffffffffffff6c;
  QSharedPointer<char> local_78;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->downloadBuffer == (char *)0x0) {
    local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    this_00 = (QSharedPointer<char> *)&(in_RDI->super_QNetworkReplyPrivate).request;
    QVariant::QVariant((QVariant *)0x1ebf36);
    QNetworkRequest::attribute
              ((QNetworkRequest *)this_00,in_stack_ffffffffffffff6c,
               (QVariant *)in_stack_ffffffffffffff50);
    QVariant::~QVariant(&local_48);
    bVar1 = QVariant::isValid((QVariant *)in_stack_ffffffffffffff50);
    if ((bVar1) && (lVar2 = QVariant::toLongLong((bool *)local_28.data), in_RSI <= lVar2)) {
      in_RDI->downloadBufferCurrentSize = 0;
      in_RDI->downloadBufferMaximumSize = in_RSI;
      pcVar3 = (char *)operator_new__(in_RDI->downloadBufferMaximumSize);
      in_RDI->downloadBuffer = pcVar3;
      QSharedPointer<char>::
      QSharedPointer<char,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qnetworkreplyimpl_cpp:539:74),_true>
                (&local_78,in_RDI->downloadBuffer);
      QSharedPointer<char>::operator=(this_00,in_stack_ffffffffffffff50);
      QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x1ebff6);
      QVariant::fromValue<QSharedPointer<char>>(this_00);
      QNetworkReply::setAttribute
                ((QNetworkReply *)in_RDI,in_stack_ffffffffffffff6c,(QVariant *)this_00);
      QVariant::~QVariant(&local_68);
    }
    QVariant::~QVariant((QVariant *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI->downloadBuffer;
}

Assistant:

char* QNetworkReplyImplPrivate::getDownloadBuffer(qint64 size)
{
    Q_Q(QNetworkReplyImpl);

    if (!downloadBuffer) {
        // We are requested to create it
        // Check attribute() if allocating a buffer of that size can be allowed
        QVariant bufferAllocationPolicy = request.attribute(QNetworkRequest::MaximumDownloadBufferSizeAttribute);
        if (bufferAllocationPolicy.isValid() && bufferAllocationPolicy.toLongLong() >= size) {
            downloadBufferCurrentSize = 0;
            downloadBufferMaximumSize = size;
            downloadBuffer = new char[downloadBufferMaximumSize]; // throws if allocation fails
            downloadBufferPointer = QSharedPointer<char>(downloadBuffer, [](auto p) { delete[] p; });

            q->setAttribute(QNetworkRequest::DownloadBufferAttribute, QVariant::fromValue<QSharedPointer<char> > (downloadBufferPointer));
        }
    }

    return downloadBuffer;
}